

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::RemoveAddedNode(CConnman *this,string *strNode)

{
  pointer pAVar1;
  pointer __s1;
  size_t __n;
  int iVar2;
  iterator __position;
  long in_FS_OFFSET;
  bool bVar3;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock88;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->m_added_nodes_mutex).super_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  __position._M_current =
       (this->m_added_node_params).
       super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
       super__Vector_impl_data._M_start;
  pAVar1 = (this->m_added_node_params).
           super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = __position._M_current != pAVar1;
  if (bVar3) {
    __s1 = (strNode->_M_dataplus)._M_p;
    __n = strNode->_M_string_length;
    do {
      if ((__n == ((__position._M_current)->m_added_node)._M_string_length) &&
         ((__n == 0 ||
          (iVar2 = bcmp(__s1,((__position._M_current)->m_added_node)._M_dataplus._M_p,__n),
          iVar2 == 0)))) {
        std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::_M_erase
                  (&this->m_added_node_params,__position);
        break;
      }
      __position._M_current = __position._M_current + 1;
      bVar3 = __position._M_current != pAVar1;
    } while (bVar3);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CConnman::RemoveAddedNode(const std::string& strNode)
{
    LOCK(m_added_nodes_mutex);
    for (auto it = m_added_node_params.begin(); it != m_added_node_params.end(); ++it) {
        if (strNode == it->m_added_node) {
            m_added_node_params.erase(it);
            return true;
        }
    }
    return false;
}